

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unbound_index.cpp
# Opt level: O3

void __thiscall
duckdb::UnboundIndex::UnboundIndex
          (UnboundIndex *this,
          unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *create_info
          ,IndexStorageInfo *storage_info_p,TableIOManager *table_io_manager,AttachedDatabase *db)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  pointer pFVar7;
  pointer pvVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  pointer pCVar11;
  reference pvVar12;
  reference pvVar13;
  InternalException *this_00;
  size_type __n;
  size_type __n_00;
  string local_50;
  
  pCVar11 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
            operator->(create_info);
  Index::Index(&this->super_Index,
               (vector<unsigned_long,_true> *)
               &pCVar11[1].dependencies.set._M_h._M_rehash_policy._M_next_resize,table_io_manager,db
              );
  (this->super_Index)._vptr_Index = (_func_int **)&PTR__UnboundIndex_0243eed8;
  (this->create_info).super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>
  ._M_t.super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
  super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl =
       (create_info->super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)
       ._M_t.super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>.
       _M_t.super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
       super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
  (create_info->super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)._M_t
  .super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
  super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl = (CreateInfo *)0x0;
  paVar2 = &(this->storage_info).name.field_2;
  (this->storage_info).name._M_dataplus._M_p = (pointer)paVar2;
  pcVar3 = (storage_info_p->name)._M_dataplus._M_p;
  paVar1 = &(storage_info_p->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined4 *)((long)&(storage_info_p->name).field_2 + 4);
    uVar5 = *(undefined4 *)((long)&(storage_info_p->name).field_2 + 8);
    uVar6 = *(undefined4 *)((long)&(storage_info_p->name).field_2 + 0xc);
    *(undefined4 *)paVar2 = *(undefined4 *)paVar1;
    *(undefined4 *)((long)&(this->storage_info).name.field_2 + 4) = uVar4;
    *(undefined4 *)((long)&(this->storage_info).name.field_2 + 8) = uVar5;
    *(undefined4 *)((long)&(this->storage_info).name.field_2 + 0xc) = uVar6;
  }
  else {
    (this->storage_info).name._M_dataplus._M_p = pcVar3;
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->storage_info).name._M_string_length = (storage_info_p->name)._M_string_length;
  (storage_info_p->name)._M_dataplus._M_p = (pointer)paVar1;
  (storage_info_p->name)._M_string_length = 0;
  (storage_info_p->name).field_2._M_local_buf[0] = '\0';
  (this->storage_info).root = storage_info_p->root;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&(this->storage_info).options._M_h,&storage_info_p->options);
  pFVar7 = (storage_info_p->allocator_infos).
           super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
           .
           super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->storage_info).allocator_infos.
  super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>.
  super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (storage_info_p->allocator_infos).
       super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
       .
       super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->storage_info).allocator_infos.
  super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>.
  super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = pFVar7;
  (this->storage_info).allocator_infos.
  super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>.
  super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (storage_info_p->allocator_infos).
       super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
       .
       super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (storage_info_p->allocator_infos).
  super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>.
  super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (storage_info_p->allocator_infos).
  super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>.
  super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (storage_info_p->allocator_infos).
  super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>.
  super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pvVar8 = (storage_info_p->buffers).
           super_vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
           .
           super__Vector_base<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->storage_info).buffers.
  super_vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
  .
  super__Vector_base<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (storage_info_p->buffers).
       super_vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
       .
       super__Vector_base<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->storage_info).buffers.
  super_vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
  .
  super__Vector_base<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar8;
  (this->storage_info).buffers.
  super_vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
  .
  super__Vector_base<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (storage_info_p->buffers).
       super_vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
       .
       super__Vector_base<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (storage_info_p->buffers).
  super_vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
  .
  super__Vector_base<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (storage_info_p->buffers).
  super_vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
  .
  super__Vector_base<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (storage_info_p->buffers).
  super_vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
  .
  super__Vector_base<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar9 = (storage_info_p->root_block_ptr).offset;
  uVar10 = (storage_info_p->root_block_ptr).unused_padding;
  (this->storage_info).root_block_ptr.block_id = (storage_info_p->root_block_ptr).block_id;
  (this->storage_info).root_block_ptr.offset = uVar9;
  (this->storage_info).root_block_ptr.unused_padding = uVar10;
  if ((this->storage_info).allocator_infos.
      super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>.
      super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->storage_info).allocator_infos.
      super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>.
      super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      pvVar12 = vector<duckdb::FixedSizeAllocatorInfo,_true>::operator[]
                          (&(this->storage_info).allocator_infos,__n);
      if ((pvVar12->buffer_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (pvVar12->buffer_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start) {
        __n_00 = 0;
        do {
          pvVar13 = vector<unsigned_long,_true>::operator[](&pvVar12->buffer_ids,__n_00);
          if (0x7ffffffffff080 < *pvVar13) {
            this_00 = (InternalException *)__cxa_allocate_exception(0x10);
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_50,"Found invalid buffer ID in UnboundIndex constructor","")
            ;
            InternalException::InternalException(this_00,&local_50);
            __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          __n_00 = __n_00 + 1;
        } while (__n_00 < (ulong)((long)(pvVar12->buffer_ids).
                                        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pvVar12->buffer_ids).
                                        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      __n = __n + 1;
    } while (__n < (ulong)((long)(this->storage_info).allocator_infos.
                                 super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
                                 .
                                 super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->storage_info).allocator_infos.
                                 super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
                                 .
                                 super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 7));
  }
  return;
}

Assistant:

UnboundIndex::UnboundIndex(unique_ptr<CreateInfo> create_info, IndexStorageInfo storage_info_p,
                           TableIOManager &table_io_manager, AttachedDatabase &db)
    : Index(create_info->Cast<CreateIndexInfo>().column_ids, table_io_manager, db), create_info(std::move(create_info)),
      storage_info(std::move(storage_info_p)) {

	// Memory safety check.
	for (idx_t info_idx = 0; info_idx < storage_info.allocator_infos.size(); info_idx++) {
		auto &info = storage_info.allocator_infos[info_idx];
		for (idx_t buffer_idx = 0; buffer_idx < info.buffer_ids.size(); buffer_idx++) {
			if (info.buffer_ids[buffer_idx] > idx_t(MAX_ROW_ID)) {
				throw InternalException("Found invalid buffer ID in UnboundIndex constructor");
			}
		}
	}
}